

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_base_assert_ok_nolock_(event_base *base)

{
  uint uVar1;
  event **ppeVar2;
  long lVar3;
  long lVar4;
  common_timeout_list *pcVar5;
  evcallback_list *peVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  event_callback *peVar10;
  ulong uVar11;
  ulong uVar12;
  event *peVar13;
  event *peVar14;
  event *peVar15;
  common_timeout_list *pcVar16;
  event_callback *peVar17;
  event_callback *peVar18;
  event_callback *peVar19;
  bool bVar20;
  bool bVar21;
  
  evmap_check_integrity_(base);
  uVar9 = (ulong)(int)(base->timeheap).n;
  if (1 < (long)uVar9) {
    ppeVar2 = (base->timeheap).p;
    uVar11 = 1;
    uVar12 = 0;
    do {
      peVar15 = ppeVar2[uVar11];
      if (((peVar15->ev_evcallback).evcb_flags & 1) == 0) goto LAB_001e33eb;
      peVar13 = ppeVar2[uVar12 >> 1 & 0x7fffffff];
      lVar3 = (peVar15->ev_timeout).tv_sec;
      lVar4 = (peVar13->ev_timeout).tv_sec;
      bVar21 = SBORROW8(lVar4,lVar3);
      lVar7 = lVar4 - lVar3;
      bVar20 = lVar4 == lVar3;
      if (bVar20) {
        lVar3 = (peVar13->ev_timeout).tv_usec;
        lVar4 = (peVar15->ev_timeout).tv_usec;
        bVar21 = SBORROW8(lVar3,lVar4);
        lVar7 = lVar3 - lVar4;
        bVar20 = lVar3 == lVar4;
      }
      if (!bVar20 && bVar21 == lVar7 < 0) goto LAB_001e33f0;
      if (uVar11 != (uint)(peVar15->ev_timeout_pos).min_heap_idx) goto LAB_001e33f5;
      uVar11 = uVar11 + 1;
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar11);
  }
  iVar8 = base->n_common_timeouts;
  if (0 < (long)iVar8) {
    uVar9 = 0;
    do {
      pcVar5 = base->common_timeout_queues[uVar9];
      peVar13 = (pcVar5->events).tqh_first;
      peVar15 = peVar13;
      if (peVar13 != (event *)0x0) {
        while ((peVar13 != (event *)0x0 &&
               (peVar15 = (peVar15->ev_timeout_pos).ev_next_with_common_timeout.tqe_next,
               peVar15 != (event *)0x0))) {
          if (peVar13 == peVar15) goto LAB_001e33d7;
          peVar15 = (peVar15->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
          if (peVar15 == (event *)0x0) break;
          peVar13 = (peVar13->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
          if (peVar13 == peVar15) goto LAB_001e33dc;
        }
        pcVar16 = pcVar5;
        for (peVar15 = (pcVar5->events).tqh_first; peVar15 != (event *)0x0;
            peVar15 = (peVar15->ev_timeout_pos).ev_next_with_common_timeout.tqe_next) {
          if (pcVar16 !=
              (common_timeout_list *)(peVar15->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev)
          goto LAB_001e33cd;
          pcVar16 = (common_timeout_list *)&peVar15->ev_timeout_pos;
        }
        if (pcVar16 != (common_timeout_list *)(pcVar5->events).tqh_last) goto LAB_001e33ff;
      }
      peVar15 = (pcVar5->events).tqh_first;
      if (peVar15 != (event *)0x0) {
        peVar13 = (event *)0x0;
        do {
          peVar14 = peVar15;
          if (peVar13 != (event *)0x0) {
            lVar3 = (peVar14->ev_timeout).tv_sec;
            lVar4 = (peVar13->ev_timeout).tv_sec;
            bVar21 = SBORROW8(lVar4,lVar3);
            lVar7 = lVar4 - lVar3;
            bVar20 = lVar4 == lVar3;
            if (bVar20) {
              lVar3 = (peVar13->ev_timeout).tv_usec;
              lVar4 = (peVar14->ev_timeout).tv_usec;
              bVar21 = SBORROW8(lVar3,lVar4);
              lVar7 = lVar3 - lVar4;
              bVar20 = lVar3 == lVar4;
            }
            if (!bVar20 && bVar21 == lVar7 < 0) goto LAB_001e33d2;
          }
          if (((peVar14->ev_evcallback).evcb_flags & 1) == 0) {
            event_base_assert_ok_nolock__cold_10();
LAB_001e33b4:
            event_base_assert_ok_nolock__cold_9();
LAB_001e33b9:
            event_base_assert_ok_nolock__cold_8();
            goto LAB_001e33be;
          }
          uVar1 = (uint)(peVar14->ev_timeout).tv_usec;
          if (((uVar1 & 0xf0000000) != 0x50000000) || (iVar8 <= (int)(uVar1 >> 0x14 & 0xff)))
          goto LAB_001e33b4;
          if (((uint)(peVar14->ev_timeout).tv_usec >> 0x14 & 0xff) != uVar9) goto LAB_001e33b9;
          peVar15 = (peVar14->ev_timeout_pos).ev_next_with_common_timeout.tqe_next;
          peVar13 = peVar14;
        } while (peVar15 != (event *)0x0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (long)iVar8);
  }
  if (0 < (long)base->nactivequeues) {
    peVar6 = base->activequeues;
    uVar9 = 0;
    iVar8 = 0;
LAB_001e32ea:
    peVar10 = (event_callback *)(peVar6 + uVar9);
    peVar17 = peVar6[uVar9].tqh_first;
    peVar19 = peVar17;
    if (peVar17 != (event_callback *)0x0) {
      while ((peVar18 = peVar10, peVar17 != (event_callback *)0x0 &&
             (peVar19 = (peVar19->evcb_active_next).tqe_next, peVar19 != (event_callback *)0x0))) {
        if (peVar17 == peVar19) goto LAB_001e33e1;
        peVar19 = (peVar19->evcb_active_next).tqe_next;
        if (peVar19 == (event_callback *)0x0) break;
        peVar17 = (peVar17->evcb_active_next).tqe_next;
        if (peVar17 == peVar19) goto LAB_001e33e6;
      }
      do {
        peVar19 = (peVar18->evcb_active_next).tqe_next;
        if (peVar19 == (event_callback *)0x0) goto LAB_001e3345;
        bVar20 = peVar18 != (event_callback *)(peVar19->evcb_active_next).tqe_prev;
        peVar18 = peVar19;
        if (bVar20) goto LAB_001e33c8;
      } while( true );
    }
    goto LAB_001e336d;
  }
  iVar8 = 0;
LAB_001e3385:
  for (peVar10 = (base->active_later_queue).tqh_first; peVar10 != (event_callback *)0x0;
      peVar10 = (peVar10->evcb_active_next).tqe_next) {
    if ((peVar10->evcb_flags & 0x28U) != 0x20) goto LAB_001e33fa;
    iVar8 = iVar8 + 1;
  }
  if (iVar8 == base->event_count_active) {
    return;
  }
LAB_001e3409:
  event_base_assert_ok_nolock__cold_18();
LAB_001e3345:
  if (peVar18 != (event_callback *)peVar6[uVar9].tqh_last) goto LAB_001e3404;
LAB_001e336d:
  while (peVar10 = (peVar10->evcb_active_next).tqe_next, peVar10 != (event_callback *)0x0) {
    if ((peVar10->evcb_flags & 0x28U) != 8) goto LAB_001e33be;
    if (uVar9 != peVar10->evcb_pri) goto LAB_001e33c3;
    iVar8 = iVar8 + 1;
  }
  uVar9 = uVar9 + 1;
  if (uVar9 == (long)base->nactivequeues) goto LAB_001e3385;
  goto LAB_001e32ea;
LAB_001e33be:
  event_base_assert_ok_nolock__cold_15();
LAB_001e33c3:
  event_base_assert_ok_nolock__cold_16();
LAB_001e33c8:
  event_base_assert_ok_nolock__cold_12();
LAB_001e33cd:
  event_base_assert_ok_nolock__cold_4();
LAB_001e33d2:
  event_base_assert_ok_nolock__cold_7();
LAB_001e33d7:
  event_base_assert_ok_nolock__cold_6();
LAB_001e33dc:
  event_base_assert_ok_nolock__cold_3();
LAB_001e33e1:
  event_base_assert_ok_nolock__cold_14();
LAB_001e33e6:
  event_base_assert_ok_nolock__cold_11();
LAB_001e33eb:
  event_base_assert_ok_nolock__cold_19();
LAB_001e33f0:
  event_base_assert_ok_nolock__cold_1();
LAB_001e33f5:
  event_base_assert_ok_nolock__cold_2();
LAB_001e33fa:
  event_base_assert_ok_nolock__cold_17();
LAB_001e33ff:
  event_base_assert_ok_nolock__cold_5();
LAB_001e3404:
  event_base_assert_ok_nolock__cold_13();
  goto LAB_001e3409;
}

Assistant:

void
event_base_assert_ok_nolock_(struct event_base *base)
{
	int i;
	int count;

	/* First do checks on the per-fd and per-signal lists */
	evmap_check_integrity_(base);

	/* Check the heap property */
	for (i = 1; i < (int)base->timeheap.n; ++i) {
		int parent = (i - 1) / 2;
		struct event *ev, *p_ev;
		ev = base->timeheap.p[i];
		p_ev = base->timeheap.p[parent];
		EVUTIL_ASSERT(ev->ev_flags & EVLIST_TIMEOUT);
		EVUTIL_ASSERT(evutil_timercmp(&p_ev->ev_timeout, &ev->ev_timeout, <=));
		EVUTIL_ASSERT(ev->ev_timeout_pos.min_heap_idx == i);
	}

	/* Check that the common timeouts are fine */
	for (i = 0; i < base->n_common_timeouts; ++i) {
		struct common_timeout_list *ctl = base->common_timeout_queues[i];
		struct event *last=NULL, *ev;

		EVUTIL_ASSERT_TAILQ_OK(&ctl->events, event, ev_timeout_pos.ev_next_with_common_timeout);

		TAILQ_FOREACH(ev, &ctl->events, ev_timeout_pos.ev_next_with_common_timeout) {
			if (last)
				EVUTIL_ASSERT(evutil_timercmp(&last->ev_timeout, &ev->ev_timeout, <=));
			EVUTIL_ASSERT(ev->ev_flags & EVLIST_TIMEOUT);
			EVUTIL_ASSERT(is_common_timeout(&ev->ev_timeout,base));
			EVUTIL_ASSERT(COMMON_TIMEOUT_IDX(&ev->ev_timeout) == i);
			last = ev;
		}
	}

	/* Check the active queues. */
	count = 0;
	for (i = 0; i < base->nactivequeues; ++i) {
		struct event_callback *evcb;
		EVUTIL_ASSERT_TAILQ_OK(&base->activequeues[i], event_callback, evcb_active_next);
		TAILQ_FOREACH(evcb, &base->activequeues[i], evcb_active_next) {
			EVUTIL_ASSERT((evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) == EVLIST_ACTIVE);
			EVUTIL_ASSERT(evcb->evcb_pri == i);
			++count;
		}
	}

	{
		struct event_callback *evcb;
		TAILQ_FOREACH(evcb, &base->active_later_queue, evcb_active_next) {
			EVUTIL_ASSERT((evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) == EVLIST_ACTIVE_LATER);
			++count;
		}
	}
	EVUTIL_ASSERT(count == base->event_count_active);
}